

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int read_global_motion_params
              (WarpedMotionParams *params,WarpedMotionParams *ref_params,aom_read_bit_buffer *rb,
              int allow_hp)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  int in_ECX;
  int *in_RDI;
  int good_shear_params;
  int trans_prec_diff;
  int trans_dec_factor;
  int trans_bits;
  TransformationType type;
  int16_t in_stack_ffffffffffffffba;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  byte local_25;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  local_25 = (byte)iVar2;
  if (local_25 != 0) {
    iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (iVar2 == 0) {
      iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_25 = 3;
      if (iVar2 != 0) {
        local_25 = 1;
      }
    }
    else {
      local_25 = 2;
    }
  }
  memcpy(in_RDI,&default_warp_params,0x24);
  *(byte *)(in_RDI + 8) = local_25;
  if (1 < local_25) {
    iVar1 = aom_rb_read_signed_primitive_refsubexpfin
                      ((aom_read_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10),
                       (uint16_t)in_stack_ffffffffffffffbc,in_stack_ffffffffffffffba);
    in_RDI[2] = iVar1 * 2 + 0x10000;
    iVar1 = aom_rb_read_signed_primitive_refsubexpfin
                      ((aom_read_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10),
                       (uint16_t)in_stack_ffffffffffffffbc,in_stack_ffffffffffffffba);
    in_RDI[3] = (int)iVar1 << 1;
  }
  if (local_25 < 3) {
    in_RDI[4] = -in_RDI[3];
    in_RDI[5] = in_RDI[2];
  }
  else {
    iVar1 = aom_rb_read_signed_primitive_refsubexpfin
                      ((aom_read_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10),
                       (uint16_t)in_stack_ffffffffffffffbc,in_stack_ffffffffffffffba);
    in_RDI[4] = (int)iVar1 << 1;
    iVar1 = aom_rb_read_signed_primitive_refsubexpfin
                      ((aom_read_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10),
                       (uint16_t)in_stack_ffffffffffffffbc,in_stack_ffffffffffffffba);
    in_RDI[5] = iVar1 * 2 + 0x10000;
  }
  if (local_25 != 0) {
    if (local_25 == 1) {
      iVar2 = 9 - (uint)((in_ECX != 0 ^ 0xffU) & 1);
      iVar3 = (1 << ((in_ECX != 0 ^ 0xffU) & 1)) << 0xd;
      iVar4 = ((in_ECX != 0 ^ 0xffU) & 1) + 0xd;
    }
    else {
      iVar2 = 0xc;
      iVar3 = 0x400;
      iVar4 = 10;
    }
    bVar5 = (byte)iVar2;
    iVar6 = iVar3;
    iVar1 = aom_rb_read_signed_primitive_refsubexpfin
                      ((aom_read_bit_buffer *)CONCAT44(iVar2,iVar3),0,(uint16_t)iVar4,
                       in_stack_ffffffffffffffba);
    *in_RDI = iVar1 * iVar3;
    iVar1 = aom_rb_read_signed_primitive_refsubexpfin
                      ((aom_read_bit_buffer *)CONCAT44(iVar2,iVar6),(uint16_t)((uint)iVar4 >> 0x10),
                       (uint16_t)iVar4,(short)(1 << (bVar5 & 0x1f)) + 1);
    in_RDI[1] = iVar1 * iVar3;
  }
  iVar2 = av1_get_shear_params
                    ((WarpedMotionParams *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  return (uint)(iVar2 != 0);
}

Assistant:

static int read_global_motion_params(WarpedMotionParams *params,
                                     const WarpedMotionParams *ref_params,
                                     struct aom_read_bit_buffer *rb,
                                     int allow_hp) {
  TransformationType type = aom_rb_read_bit(rb);
  if (type != IDENTITY) {
    if (aom_rb_read_bit(rb))
      type = ROTZOOM;
    else
      type = aom_rb_read_bit(rb) ? TRANSLATION : AFFINE;
  }

  *params = default_warp_params;
  params->wmtype = type;

  if (type >= ROTZOOM) {
    params->wmmat[2] = aom_rb_read_signed_primitive_refsubexpfin(
                           rb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
                           (ref_params->wmmat[2] >> GM_ALPHA_PREC_DIFF) -
                               (1 << GM_ALPHA_PREC_BITS)) *
                           GM_ALPHA_DECODE_FACTOR +
                       (1 << WARPEDMODEL_PREC_BITS);
    params->wmmat[3] = aom_rb_read_signed_primitive_refsubexpfin(
                           rb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
                           (ref_params->wmmat[3] >> GM_ALPHA_PREC_DIFF)) *
                       GM_ALPHA_DECODE_FACTOR;
  }

  if (type >= AFFINE) {
    params->wmmat[4] = aom_rb_read_signed_primitive_refsubexpfin(
                           rb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
                           (ref_params->wmmat[4] >> GM_ALPHA_PREC_DIFF)) *
                       GM_ALPHA_DECODE_FACTOR;
    params->wmmat[5] = aom_rb_read_signed_primitive_refsubexpfin(
                           rb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
                           (ref_params->wmmat[5] >> GM_ALPHA_PREC_DIFF) -
                               (1 << GM_ALPHA_PREC_BITS)) *
                           GM_ALPHA_DECODE_FACTOR +
                       (1 << WARPEDMODEL_PREC_BITS);
  } else {
    params->wmmat[4] = -params->wmmat[3];
    params->wmmat[5] = params->wmmat[2];
  }

  if (type >= TRANSLATION) {
    const int trans_bits = (type == TRANSLATION)
                               ? GM_ABS_TRANS_ONLY_BITS - !allow_hp
                               : GM_ABS_TRANS_BITS;
    const int trans_dec_factor =
        (type == TRANSLATION) ? GM_TRANS_ONLY_DECODE_FACTOR * (1 << !allow_hp)
                              : GM_TRANS_DECODE_FACTOR;
    const int trans_prec_diff = (type == TRANSLATION)
                                    ? GM_TRANS_ONLY_PREC_DIFF + !allow_hp
                                    : GM_TRANS_PREC_DIFF;
    params->wmmat[0] = aom_rb_read_signed_primitive_refsubexpfin(
                           rb, (1 << trans_bits) + 1, SUBEXPFIN_K,
                           (ref_params->wmmat[0] >> trans_prec_diff)) *
                       trans_dec_factor;
    params->wmmat[1] = aom_rb_read_signed_primitive_refsubexpfin(
                           rb, (1 << trans_bits) + 1, SUBEXPFIN_K,
                           (ref_params->wmmat[1] >> trans_prec_diff)) *
                       trans_dec_factor;
  }

  int good_shear_params = av1_get_shear_params(params);
  if (!good_shear_params) return 0;

  return 1;
}